

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O0

bool duckdb::Leaf::DeprecatedGetRowIds
               (ART *art,Node *node,unsafe_vector<row_t> *row_ids,idx_t max_count)

{
  bool bVar1;
  IndexPointer *this;
  Node *pNVar2;
  Leaf *pLVar3;
  size_type sVar4;
  ulong in_RCX;
  vector<long,_std::allocator<long>_> *in_RDX;
  Node *in_RDI;
  uint8_t i;
  Leaf *leaf;
  reference<const_Node> ref;
  Node *in_stack_ffffffffffffffa8;
  Node *__uref;
  undefined7 in_stack_ffffffffffffffb0;
  NType in_stack_ffffffffffffffb7;
  undefined7 in_stack_ffffffffffffffb8;
  byte in_stack_ffffffffffffffbf;
  IndexPointer ptr;
  reference_wrapper<const_duckdb::Node> local_30;
  ulong local_28;
  vector<long,_std::allocator<long>_> *local_20;
  Node *local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  ::std::reference_wrapper<duckdb::Node_const>::
  reference_wrapper<duckdb::Node_const&,void,duckdb::Node_const*>
            ((reference_wrapper<const_duckdb::Node> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  while( true ) {
    this = &::std::reference_wrapper<const_duckdb::Node>::get(&local_30)->super_IndexPointer;
    bVar1 = IndexPointer::HasMetadata(this);
    if (!bVar1) {
      return true;
    }
    __uref = local_10;
    pNVar2 = ::std::reference_wrapper::operator_cast_to_Node_
                       ((reference_wrapper<const_duckdb::Node> *)0x18d1475);
    ptr.data = (pNVar2->super_IndexPointer).data;
    pLVar3 = Node::Ref<duckdb::Leaf_const>
                       ((ART *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                        (Node)ptr.data,in_stack_ffffffffffffffb7);
    sVar4 = ::std::vector<long,_std::allocator<long>_>::size(local_20);
    if (local_28 < sVar4 + pLVar3->count) break;
    for (in_stack_ffffffffffffffbf = 0; in_stack_ffffffffffffffbf < pLVar3->count;
        in_stack_ffffffffffffffbf = in_stack_ffffffffffffffbf + 1) {
      ::std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)ptr.data,
                 (value_type_conflict5 *)
                 CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    }
    ::std::reference_wrapper<duckdb::Node_const>::
    reference_wrapper<duckdb::Node_const&,void,duckdb::Node_const*>
              ((reference_wrapper<const_duckdb::Node> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),__uref);
  }
  return false;
}

Assistant:

bool Leaf::DeprecatedGetRowIds(ART &art, const Node &node, unsafe_vector<row_t> &row_ids, const idx_t max_count) {
	D_ASSERT(node.GetType() == LEAF);

	reference<const Node> ref(node);
	while (ref.get().HasMetadata()) {

		auto &leaf = Node::Ref<const Leaf>(art, ref, LEAF);
		if (row_ids.size() + leaf.count > max_count) {
			return false;
		}
		for (uint8_t i = 0; i < leaf.count; i++) {
			row_ids.push_back(leaf.row_ids[i]);
		}
		ref = leaf.ptr;
	}
	return true;
}